

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O0

int anon_unknown.dwarf_fc70::RtMidiIn_getmessage(lua_State *L)

{
  double dVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  size_type local_60;
  size_t i;
  size_type n;
  double dt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg;
  RtMidiIn *self;
  lua_State *L_local;
  
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)getRtMidiIn(L,1);
  dt = 0.0;
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dt);
  dVar1 = RtMidiIn::getMessage
                    ((RtMidiIn *)
                     msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dt);
  if (((dVar1 != 0.0) || (NAN(dVar1))) ||
     (bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dt), !bVar2)) {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dt);
    lua_pushnumber(SUB84(dVar1,0),L);
    lua_createtable(L,sVar3 & 0xffffffff,0);
    for (local_60 = 0; local_60 < sVar3; local_60 = local_60 + 1) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dt,local_60);
      lua_pushinteger(L,*pvVar4);
      lua_rawseti(L,0xfffffffe,local_60 + 1);
    }
    L_local._4_4_ = 2;
  }
  else {
    L_local._4_4_ = 0;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dt);
  return L_local._4_4_;
}

Assistant:

int RtMidiIn_getmessage(lua_State *L) {
	auto &self = getRtMidiIn(L, 1);
	auto msg = std::vector<unsigned char> { };
	double dt = self.getMessage(&msg);
	if (dt == 0.0 && msg.empty())
		return 0;

	auto n = msg.size();
	lua_pushnumber(L, dt);
	lua_createtable(L, n, 0);
	for (std::size_t i = 0; i < n; ++i) {
		lua_pushinteger(L, msg[i]);
		lua_rawseti(L, -2, i + 1);
	}
	return 2;
}